

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>::resize_internal
          (QList<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *this,
          qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *this_00;
  __off_t __length;
  QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *in_RSI;
  QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *in_RDI;
  QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>
  *in_stack_ffffffffffffffd0;
  QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *this_01;
  QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>
  *in_stack_ffffffffffffffd8;
  QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>
  *in_stack_ffffffffffffffe0;
  QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *__file;
  
  QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>::operator->(in_RDI)
  ;
  bVar1 = QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>::
          needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *)
         capacity((QList<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *)0x1db641);
    qVar2 = QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>::
            freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QGenericArrayOps<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *)
                QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>::
                operator->(in_RDI);
      QtPrivate::QGenericArrayOps<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>::
      truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (pair<BuildsMetaMakefileGenerator::Build_*,_ProString> **)in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}